

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::AddFunctionBlocker
          (cmMakefile *this,
          unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *fb)

{
  bool bVar1;
  pointer this_00;
  cmListFileContext *lfc;
  unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *fb_local;
  cmMakefile *this_local;
  
  bVar1 = std::vector<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>::empty
                    (&this->ExecutionStatusStack);
  if (!bVar1) {
    this_00 = std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>::
              operator->(fb);
    lfc = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                    (&(this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
    cmFunctionBlocker::SetStartingContext(this_00,lfc);
  }
  std::
  stack<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>,_std::vector<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>,_std::allocator<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>_>_>_>
  ::push(&this->FunctionBlockers,fb);
  return;
}

Assistant:

void cmMakefile::AddFunctionBlocker(std::unique_ptr<cmFunctionBlocker> fb)
{
  if (!this->ExecutionStatusStack.empty()) {
    // Record the context in which the blocker is created.
    fb->SetStartingContext(this->Backtrace.Top());
  }

  this->FunctionBlockers.push(std::move(fb));
}